

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
               (uhugeint_t *ldata,uhugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar3;
  uint64_t uVar4;
  uhugeint_t *puVar5;
  bool bVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  uhugeint_t uVar13;
  uhugeint_t uVar14;
  uhugeint_t uVar15;
  uhugeint_t local_88;
  ValidityMask *local_78;
  idx_t local_70;
  uhugeint_t *local_68;
  ulong local_60;
  uhugeint_t *local_58;
  ulong local_50;
  long local_48;
  uhugeint_t local_40;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_78 = mask;
  local_70 = count;
  local_68 = result_data;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar8 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar8);
        local_88.lower = *puVar1;
        local_88.upper = puVar1[1];
        uhugeint_t::uhugeint_t(&local_40,0);
        bVar6 = uhugeint_t::operator<(&local_88,&local_40);
        if (bVar6) {
          uVar13 = uhugeint_t::operator-(&local_88);
        }
        else {
          uVar13.upper = local_88.upper;
          uVar13.lower = local_88.lower;
        }
        *(uint64_t *)((long)&local_68->lower + lVar8) = uVar13.lower;
        *(uint64_t *)((long)&local_68->upper + lVar8) = uVar13.upper;
        lVar8 = lVar8 + 0x10;
        local_70 = local_70 - 1;
      } while (local_70 != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_40.lower = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long **)mask,&local_40.lower);
      uVar4 = local_88.upper;
      uVar3 = local_88.lower;
      local_88.lower = 0;
      local_88.upper = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.upper !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.upper);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_60 = count + 0x3f >> 6;
      local_50 = 0;
      uVar9 = 0;
      local_58 = ldata;
      do {
        puVar5 = local_58;
        puVar2 = (local_78->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = puVar2[local_50];
        }
        uVar11 = uVar9 + 0x40;
        if (local_70 <= uVar9 + 0x40) {
          uVar11 = local_70;
        }
        uVar10 = uVar11;
        if (uVar12 != 0) {
          uVar10 = uVar9;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar9 < uVar11) {
              lVar8 = uVar9 << 4;
              do {
                puVar1 = (uint64_t *)((long)&puVar5->lower + lVar8);
                local_88.lower = *puVar1;
                local_88.upper = puVar1[1];
                uhugeint_t::uhugeint_t(&local_40,0);
                bVar6 = uhugeint_t::operator<(&local_88,&local_40);
                if (bVar6) {
                  uVar14 = uhugeint_t::operator-(&local_88);
                }
                else {
                  uVar14.upper = local_88.upper;
                  uVar14.lower = local_88.lower;
                }
                *(uint64_t *)((long)&local_68->lower + lVar8) = uVar14.lower;
                *(uint64_t *)((long)&local_68->upper + lVar8) = uVar14.upper;
                uVar10 = uVar10 + 1;
                lVar8 = lVar8 + 0x10;
              } while (uVar11 != uVar10);
            }
          }
          else {
            local_48 = uVar9 - uVar11;
            if (uVar9 < uVar11) {
              lVar8 = uVar9 << 4;
              uVar11 = 0;
              do {
                if ((uVar12 >> (uVar11 & 0x3f) & 1) != 0) {
                  puVar1 = (uint64_t *)((long)&local_58->lower + lVar8);
                  local_88.lower = *puVar1;
                  local_88.upper = puVar1[1];
                  uhugeint_t::uhugeint_t(&local_40,0);
                  bVar6 = uhugeint_t::operator<(&local_88,&local_40);
                  if (bVar6) {
                    uVar15 = uhugeint_t::operator-(&local_88);
                  }
                  else {
                    uVar15.upper = local_88.upper;
                    uVar15.lower = local_88.lower;
                  }
                  *(uint64_t *)((long)&local_68->lower + lVar8) = uVar15.lower;
                  *(uint64_t *)((long)&local_68->upper + lVar8) = uVar15.upper;
                }
                uVar11 = uVar11 + 1;
                lVar8 = lVar8 + 0x10;
              } while (local_48 + uVar11 != 0);
              uVar10 = uVar9 + uVar11;
            }
          }
        }
        local_50 = local_50 + 1;
        uVar9 = uVar10;
      } while (local_50 != local_60);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}